

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O0

void __thiscall
deqp::gls::StateChangeCallPerformanceCase::executeTest(StateChangeCallPerformanceCase *this)

{
  deUint64 dVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type sVar3;
  value_type_conflict9 local_30;
  deUint64 local_28;
  deUint64 endTimeUs;
  deUint64 beginTimeUs;
  Functions *gl;
  StateChangeCallPerformanceCase *this_local;
  
  gl = (Functions *)this;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  beginTimeUs = CONCAT44(extraout_var,iVar2);
  endTimeUs = 0;
  local_28 = 0;
  endTimeUs = deGetMicroseconds();
  dVar1 = beginTimeUs;
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_results);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])
            (this,dVar1,sVar3 & 0xffffffff,(ulong)(uint)this->m_callCount);
  local_28 = deGetMicroseconds();
  local_30 = local_28 - endTimeUs;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->m_results,&local_30);
  return;
}

Assistant:

void StateChangeCallPerformanceCase::executeTest (void)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	deUint64				beginTimeUs		= 0;
	deUint64				endTimeUs		= 0;

	beginTimeUs = deGetMicroseconds();

	execCalls(gl, (int)m_results.size(), m_callCount);

	endTimeUs = deGetMicroseconds();

	m_results.push_back(endTimeUs - beginTimeUs);
}